

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataLisp.cpp
# Opt level: O1

string_t * __thiscall DL::DataLisp::dump_abi_cxx11_(string_t *__return_storage_ptr__,DataLisp *this)

{
  DataLisp_Internal *pDVar1;
  SyntaxTree *pSVar2;
  pointer ppSVar3;
  int in_ECX;
  pointer ppSVar4;
  string_t local_50;
  
  pDVar1 = this->mInternal;
  pSVar2 = pDVar1->mTree;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (pSVar2 == (SyntaxTree *)0x0) {
    std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"");
  }
  else {
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
    pSVar2 = pDVar1->mTree;
    ppSVar4 = (pSVar2->Nodes).
              super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppSVar3 = (pSVar2->Nodes).
              super__Vector_base<DL::StatementNode_*,_std::allocator<DL::StatementNode_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    if (ppSVar4 != ppSVar3) {
      do {
        DataLisp_Internal::dumpNode_abi_cxx11_
                  (&local_50,(DataLisp_Internal *)*ppSVar4,(StatementNode *)0x1,in_ECX);
        std::__cxx11::string::_M_append
                  ((char *)__return_storage_ptr__,(ulong)local_50._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_50._M_dataplus._M_p != &local_50.field_2) {
          operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        ppSVar4 = ppSVar4 + 1;
      } while (ppSVar4 != ppSVar3);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

string_t DataLisp::dump()
{
	if (!mInternal->mTree) {
		return "";
	} else {
		string_t str;
		for (StatementNode* ptr : mInternal->mTree->Nodes)
			str += DataLisp_Internal::dumpNode(ptr, 1);

		return str;
	}
}